

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O3

ssize_t __thiscall AudioFileWriter::write(AudioFileWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  QDebug this_00;
  uint uVar2;
  ushort *puVar3;
  ssize_t sVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  ushort *puVar8;
  uint uVar9;
  ulong uVar10;
  QByteArrayView QVar11;
  qint16 cnvBuffer [8192];
  QDebug local_4080;
  QArrayData *local_4078;
  undefined8 *local_4070;
  AudioFileWriter *local_4060;
  undefined4 local_4058;
  undefined8 local_4054;
  undefined8 uStack_404c;
  undefined4 local_4044;
  char *local_4040;
  ushort local_4038 [8196];
  
  puVar8 = (ushort *)CONCAT44(in_register_00000034,__fd);
  uVar10 = (ulong)__buf & 0xffffffff;
  puVar3 = (ushort *)QIODevice::isOpen();
  if ((char)puVar3 == '\0') {
LAB_0012c2b2:
    sVar4 = 0;
  }
  else {
    if (this->skipSilence == true) {
      if ((int)__buf != 0) {
        puVar3 = puVar8 + ((ulong)__buf & 0xffffffff) * 2;
        uVar10 = ((ulong)__buf & 0xffffffff) << 2;
        do {
          if (*(int *)puVar8 != 0) {
            this->skipSilence = false;
            uVar10 = uVar10 >> 2;
            goto LAB_0012c10e;
          }
          puVar8 = puVar8 + 2;
          uVar10 = uVar10 - 4;
        } while (puVar8 < puVar3);
      }
    }
    else {
LAB_0012c10e:
      local_4060 = this;
      if ((int)uVar10 == 0) {
        return CONCAT71((int7)((ulong)puVar3 >> 8),1);
      }
      do {
        uVar9 = (uint)uVar10;
        uVar2 = 0x1000;
        if (uVar9 < 0x1000) {
          uVar2 = uVar9;
        }
        puVar3 = puVar8;
        uVar5 = uVar9;
        if (local_4060->waveMode == false) {
          if (0xfff < (uVar10 & 0xffffffff)) {
            uVar5 = 0x1000;
          }
          lVar6 = 0;
          do {
            local_4038[lVar6] = puVar8[lVar6] << 8 | puVar8[lVar6] >> 8;
            lVar6 = lVar6 + 1;
          } while (uVar5 * 2 != (int)lVar6);
          puVar3 = local_4038;
          uVar5 = uVar2;
        }
        if (uVar5 * 4 != 0) {
          uVar10 = (ulong)(uVar5 * 4);
          do {
            lVar6 = QIODevice::write((char *)&this->file,(longlong)puVar3);
            if (lVar6 == -1) {
              local_4058 = 2;
              local_4054 = 0;
              uStack_404c = 0;
              local_4044 = 0;
              local_4040 = "default";
              QMessageLogger::debug();
              this_00.stream = local_4080.stream;
              QVar11.m_data = (storage_type *)0x33;
              QVar11.m_size = (qsizetype)&local_4078;
              QString::fromUtf8(QVar11);
              QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)&local_4078);
              if (local_4078 != (QArrayData *)0x0) {
                LOCK();
                (local_4078->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_4078->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_4078->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_4078,2,8);
                }
              }
              if (*(QTextStream *)(local_4080.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_4080.stream,' ');
              }
              QIODevice::errorString();
              if (local_4070 == (undefined8 *)0x0) {
                local_4070 = &QString::_empty;
              }
              QDebug::putString((QChar *)&local_4080,(ulong)local_4070);
              if (*(QTextStream *)(local_4080.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_4080.stream,' ');
              }
              if (local_4078 != (QArrayData *)0x0) {
                LOCK();
                (local_4078->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_4078->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_4078->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_4078,2,8);
                }
              }
              QDebug::~QDebug(&local_4080);
              QFileDevice::close();
              goto LAB_0012c2b2;
            }
            puVar3 = (ushort *)((long)puVar3 + lVar6);
            uVar7 = uVar10 - lVar6;
            bVar1 = lVar6 <= (long)uVar10;
            uVar10 = uVar7;
          } while (uVar7 != 0 && bVar1);
        }
        puVar3 = (ushort *)(ulong)(uVar5 * 2);
        puVar8 = puVar8 + (long)puVar3;
        uVar10 = (ulong)(uVar9 - uVar5);
      } while (uVar9 - uVar5 != 0);
    }
    sVar4 = CONCAT71((int7)((ulong)puVar3 >> 8),1);
  }
  return sVar4;
}

Assistant:

bool AudioFileWriter::write(const qint16 *buffer, uint totalFrames) {
	static const uint MAX_FRAMES_PER_RUN = 4096;

	if (!file.isOpen()) return false;

	const qint32 *startPos = (const qint32 *)buffer;
	if (skipSilence) {
		const qint32 *endPos = startPos + totalFrames;
		totalFrames = 0;
		for (const qint32 *p = startPos; p < endPos; p++) {
			if (*p != 0) {
				skipSilence = false;
				totalFrames = endPos - p;
				buffer = (const qint16 *)p;
				break;
			}
		}
	}

	qint16 cnvBuffer[MAX_FRAMES_PER_RUN << 1];
	while (totalFrames > 0) {
		uint framesToWrite = qMin(MAX_FRAMES_PER_RUN, totalFrames);
		bool converted = convertSamplesFromNativeEndian(buffer, cnvBuffer, framesToWrite << 1, waveMode ? QSysInfo::LittleEndian : QSysInfo::BigEndian);
		if (!converted) framesToWrite = totalFrames;

		const char *bufferPos = (const char *)(converted ? cnvBuffer : buffer);
		qint64 bytesToWrite = framesToWrite * FRAME_SIZE;
		while (bytesToWrite > 0) {
			qint64 bytesWritten = file.write(bufferPos, bytesToWrite);
			if (bytesWritten == -1) {
				qDebug() << "AudioFileWriter: error writing into the audio file:" << file.errorString();
				file.close();
				return false;
			}
			bytesToWrite -= bytesWritten;
			bufferPos += bytesWritten;
		}
		buffer += framesToWrite << 1;
		totalFrames -= framesToWrite;
	}
	return true;
}